

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

void __thiscall
ikfast::IkSolution<double>::GetSolution
          (IkSolution<double> *this,vector<double,_std::allocator<double>_> *solution,
          vector<double,_std::allocator<double>_> *freevalues)

{
  int iVar1;
  reference pvVar2;
  const_reference pvVar3;
  
  iVar1 = (*(this->super_IkSolutionBase<double>)._vptr_IkSolutionBase[5])();
  std::vector<double,_std::allocator<double>_>::resize(solution,(long)iVar1);
  pvVar3 = (const_reference)0x0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::at(solution,0);
  if ((freevalues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (freevalues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(freevalues,0);
  }
  (*(this->super_IkSolutionBase<double>)._vptr_IkSolutionBase[2])(this,pvVar2,pvVar3);
  return;
}

Assistant:

virtual void GetSolution(std::vector<T>& solution, const std::vector<T>& freevalues) const {
        solution.resize(GetDOF());
        GetSolution(&solution.at(0), freevalues.size() > 0 ? &freevalues.at(0) : NULL);
    }